

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_losertree.cpp
# Opt level: O0

void mergesort_losertree_parallel<512u>(uchar **strings,size_t n,uchar **tmp)

{
  uchar **strings_00;
  size_t n_00;
  ulong uVar1;
  reference pvVar2;
  iterator begin;
  iterator end;
  uchar *puVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 local_2090 [8];
  loser_tree<unsigned_char_*> tree;
  uchar **result;
  unsigned_long uStack_2068;
  uint i_1;
  uchar **local_2060;
  pair<unsigned_char_**,_unsigned_long> local_2058;
  uchar **local_2048;
  pair<unsigned_char_**,_unsigned_long> local_2040;
  uint local_202c;
  undefined1 local_2028 [4];
  uint i;
  array<std::pair<unsigned_char_**,_unsigned_long>,_512UL> ranges;
  size_t split;
  uchar **tmp_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x10000) {
    mergesort_4way_parallel(strings,n,tmp);
  }
  else {
    auVar5._8_4_ = (int)(n >> 0x20);
    auVar5._0_8_ = n;
    auVar5._12_4_ = 0x45300000;
    dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.001953125;
    uVar1 = (ulong)dVar4;
    ranges._M_elems[0x1ff].second =
         uVar1 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f;
    std::array<std::pair<unsigned_char_**,_unsigned_long>,_512UL>::array
              ((array<std::pair<unsigned_char_**,_unsigned_long>,_512UL> *)local_2028);
    for (local_202c = 0; local_202c < 0x1ff; local_202c = local_202c + 1) {
      local_2048 = strings + local_202c * ranges._M_elems[0x1ff].second;
      local_2040 = std::make_pair<unsigned_char**,unsigned_long_const&>
                             (&local_2048,&ranges._M_elems[0x1ff].second);
      pvVar2 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_512UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_512UL> *)local_2028,
                          (ulong)local_202c);
      std::pair<unsigned_char_**,_unsigned_long>::operator=(pvVar2,&local_2040);
    }
    local_2060 = strings + ranges._M_elems[0x1ff].second * 0x1ff;
    uStack_2068 = n + ranges._M_elems[0x1ff].second * -0x1ff;
    local_2058 = std::make_pair<unsigned_char**,unsigned_long>(&local_2060,&stack0xffffffffffffdf98)
    ;
    pvVar2 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_512UL>::operator[]
                       ((array<std::pair<unsigned_char_**,_unsigned_long>,_512UL> *)local_2028,0x1ff
                       );
    std::pair<unsigned_char_**,_unsigned_long>::operator=(pvVar2,&local_2058);
    for (result._4_4_ = 0; result._4_4_ < 0x200; result._4_4_ = result._4_4_ + 1) {
      pvVar2 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_512UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_512UL> *)local_2028,
                          (ulong)result._4_4_);
      strings_00 = pvVar2->first;
      pvVar2 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_512UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_512UL> *)local_2028,
                          (ulong)result._4_4_);
      n_00 = pvVar2->second;
      pvVar2 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_512UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_512UL> *)local_2028,
                          (ulong)result._4_4_);
      mergesort_losertree_parallel<512u>
                (strings_00,n_00,tmp + ((long)pvVar2->first - (long)strings >> 3));
    }
    tree._16_8_ = tmp;
    begin = std::array<std::pair<unsigned_char_**,_unsigned_long>,_512UL>::begin
                      ((array<std::pair<unsigned_char_**,_unsigned_long>,_512UL> *)local_2028);
    end = std::array<std::pair<unsigned_char_**,_unsigned_long>,_512UL>::end
                    ((array<std::pair<unsigned_char_**,_unsigned_long>,_512UL> *)local_2028);
    loser_tree<unsigned_char*>::loser_tree<std::pair<unsigned_char**,unsigned_long>*>
              ((loser_tree<unsigned_char*> *)local_2090,begin,end);
    while ((int)tree._streams != 0) {
      puVar3 = loser_tree<unsigned_char_*>::min((loser_tree<unsigned_char_*> *)local_2090);
      *(uchar **)tree._16_8_ = puVar3;
      tree._16_8_ = tree._16_8_ + 8;
    }
    memcpy(strings,tmp,n << 3);
    loser_tree<unsigned_char_*>::~loser_tree((loser_tree<unsigned_char_*> *)local_2090);
  }
  return;
}

Assistant:

static void
mergesort_losertree_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	if (n < 0x10000) {
		mergesort_4way_parallel(strings, n, tmp);
		return;
	}
	debug() << __func__ << "(), n="<<n<<"\n";
	const size_t split = size_t(double(n) / double(K));
	std::array<std::pair<unsigned char**, size_t>, K> ranges;
	for (unsigned i=0; i < K-1; ++i) {
		ranges[i] = std::make_pair(strings+i*split, split);
	}
	ranges[K-1] = std::make_pair(strings+(K-1)*split, n-(K-1)*split);
#pragma omp parallel for
	for (unsigned i=0; i < K; ++i) {
		mergesort_losertree_parallel<K>(ranges[i].first, ranges[i].second,
				tmp+(ranges[i].first-strings));
	}
	unsigned char** result = tmp;
	loser_tree<unsigned char*> tree(ranges.begin(), ranges.end());
	while (tree._nonempty_streams) { *result++ = tree.min(); }
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}